

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::ChecksumAndWrite
          (SingleFileBlockManager *this,FileBuffer *block,uint64_t location,bool skip_block_header)

{
  idx_t iVar1;
  uint64_t uVar2;
  type handle;
  size_t __n;
  
  iVar1 = BlockManager::GetBlockHeaderSize(&this->super_BlockManager);
  __n = iVar1 - 8;
  if (__n == 0 || !skip_block_header) {
    uVar2 = Checksum(block->buffer,block->size);
  }
  else {
    memmove(block->internal_buffer + 8,block->buffer,block->size);
    switchD_014c3389::default(block->internal_buffer + block->size + 8,0,__n);
    uVar2 = Checksum(block->buffer + (8 - iVar1),__n + block->size);
    __n = 0;
  }
  *(uint64_t *)(block->internal_buffer + __n) = uVar2;
  handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
                     (&this->handle);
  FileBuffer::Write(block,handle,location);
  return;
}

Assistant:

void SingleFileBlockManager::ChecksumAndWrite(FileBuffer &block, uint64_t location, bool skip_block_header) const {
	auto delta = GetBlockHeaderSize() - Storage::DEFAULT_BLOCK_HEADER_SIZE;

	uint64_t checksum;
	if (skip_block_header && delta > 0) {
		//! This happens only for the Main Database Header
		memmove(block.InternalBuffer() + Storage::DEFAULT_BLOCK_HEADER_SIZE, block.buffer, block.Size());
		//! zero out the last bytes of the block
		memset(block.InternalBuffer() + block.Size() + Storage::DEFAULT_BLOCK_HEADER_SIZE, 0, delta);
		checksum = Checksum(block.buffer - delta, block.Size() + delta);
		delta = 0;
	} else {
		checksum = Checksum(block.buffer, block.Size());
	}

	Store<uint64_t>(checksum, block.InternalBuffer() + delta);

	// now write the buffer
	block.Write(*handle, location);
}